

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O1

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::find(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
       *this,RBPath *path,K value)

{
  size_t sVar1;
  RBStep *pRVar2;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *pFVar3;
  bool bVar4;
  
  if (*(path->path)._M_elems[path->length - 1].node.ptr.val < 2) {
    return false;
  }
  sVar1 = path->length;
  pRVar2 = (path->path)._M_elems + sVar1;
  do {
    sVar1 = sVar1 + 1;
    pFVar3 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
              *)(**(ulong **)(pRVar2 + -1) & 0xfffffffffffffffe);
    bVar4 = pFVar3 == value.unsafe_capptr;
    if (bVar4) {
      return bVar4;
    }
    (pRVar2->node).ptr.val = (uintptr_t *)(&pFVar3->left + (pFVar3 <= value.unsafe_capptr));
    pRVar2->dir = value.unsafe_capptr < pFVar3;
    path->length = sVar1;
    pRVar2 = pRVar2 + 1;
  } while ((FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
            *)0x1 < (&pFVar3->left)[pFVar3 <= value.unsafe_capptr].unsafe_capptr);
  return bVar4;
}

Assistant:

ChildRef ith(size_t n)
      {
        SNMALLOC_ASSERT(length >= n);
        return path[length - n - 1].node;
      }